

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::Iterator<Kernel::TypedTermList>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  TypedTermList query_00;
  byte bVar1;
  byte bVar2;
  TermList in_RDX;
  SortId in_RSI;
  long in_RDI;
  Stack<Lib::BacktrackData> *this_00;
  byte in_R9B;
  byte in_stack_00000008;
  size_t in_stack_ffffffffffffff78;
  Stack<unsigned_int> *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  Node *in_stack_ffffffffffffffc0;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  
  bVar2 = in_R9B & 1;
  bVar1 = in_stack_00000008 & 1;
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::RobUnification
            ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)0x3c757f);
  Lib::Stack<unsigned_int>::Stack(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)0x3c75b1);
  this_00 = (Stack<Lib::BacktrackData> *)(in_RDI + 0x100);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
  ::Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
           *)this_00,in_stack_ffffffffffffff78);
  Lib::BacktrackData::BacktrackData((BacktrackData *)(in_RDI + 0x120));
  Lib::Stack<Lib::BacktrackData>::Stack(this_00,in_RDI + 0x128);
  Lib::BacktrackData::BacktrackData((BacktrackData *)(in_RDI + 0x150));
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 0x158));
  query_00._sort._content = in_RSI._content;
  query_00.super_TermList._content = in_RDX._content;
  init<Kernel::TypedTermList>
            ((Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
              *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,query_00,(bool)in_stack_ffffffffffffffbf,
             (bool)in_stack_ffffffffffffffbe);
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }